

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O0

_Bool borg_remove_stuff(void)

{
  bool bVar1;
  int32_t iVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  borg_item_conflict *item_00;
  char *what;
  _Bool fix;
  borg_item *item;
  uint local_20;
  wchar_t b_i;
  wchar_t i;
  int32_t w_p;
  int32_t b_p;
  int32_t p;
  wchar_t hole;
  
  wVar4 = borg_first_empty_inventory_slot();
  iVar2 = borg.power;
  b_i = L'\0';
  item._4_4_ = 0xffffffff;
  bVar1 = false;
  if (wVar4 == L'\xffffffff') {
    p._3_1_ = false;
  }
  else if ((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) {
    if (borg_t - borg_began < 0x7d1) {
      if (borg.time_this_panel < 0x97) {
        for (local_20 = (uint)z_info->pack_size; (int)local_20 < (int)(z_info->pack_size + 0xc);
            local_20 = local_20 + 1) {
          item_00 = borg_items + (int)local_20;
          if ((((item_00->iqty != '\0') && ((item_00->aware & 1U) != 0)) &&
              ((_Var3 = borg_item_note_needs_id(item_00), !_Var3 || ((item_00->cursed & 1U) != 0))))
             && ((item_00->one_ring & 1U) == 0)) {
            memcpy(borg_items + wVar4,item_00,0x388);
            memcpy(item_00,safe_items + wVar4,0x388);
            bVar1 = true;
            borg_notice(true);
            wVar5 = borg_power();
            memcpy(item_00,safe_items + (int)local_20,0x388);
            borg_items[wVar4].iqty = '\0';
            if (iVar2 <= wVar5) {
              item._4_4_ = local_20;
              b_i = wVar5;
            }
          }
        }
        if (bVar1) {
          borg_notice(true);
        }
        if ((int)item._4_4_ < 0) {
          p._3_1_ = false;
        }
        else {
          what = format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",
                        borg_items + (int)item._4_4_,(long)iVar2,(long)b_i);
          borg_note(what);
          borg_keypress(0x74);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             [(int)(item._4_4_ - z_info->pack_size)]);
          borg.time_this_panel = borg.time_this_panel + 1;
          p._3_1_ = true;
        }
      }
      else {
        p._3_1_ = false;
      }
    }
    else {
      p._3_1_ = false;
    }
  }
  else {
    p._3_1_ = false;
  }
  return p._3_1_;
}

Assistant:

bool borg_remove_stuff(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L, w_p = 0L;

    int i, b_i = -1;

    borg_item *item;

    bool fix = false;

    /* if there was no hole, done */
    if (hole == -1)
        return false;

    /*  hack to prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;
    if (borg.time_this_panel > 150)
        return false;

    /* Start with good power */
    b_p = borg.power;

    /* Scan equip */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Require "known" (or needs id) unless we know it is cursed */
        if (borg_item_note_needs_id(item) && !item->cursed)
            continue;

        /* skip it if it has not been decursed */
        if (item->one_ring)
            continue;

        /* Take off the item */
        memcpy(&borg_items[hole], item, sizeof(borg_item));

        /* Erase the item from equip */
        /* note, copy the "hole" onto the item so it doesn't have attributes */
        memcpy(item, &safe_items[hole], sizeof(borg_item));

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* Restore the item */
        memcpy(item, &safe_items[i], sizeof(borg_item));

        /* Restore the hole */
        borg_items[hole].iqty = 0;

        /* Track the crappy items */
        /* crappy includes things that do not add to power */

        if (p >= b_p) {
            b_i = i;
            w_p = p;
        }
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if (b_i >= 0) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note(format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",
            item->desc, (long int)b_p, (long int)w_p));

        /* Wear it */
        borg_keypress('t');
        borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}